

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int sftp_mkdir(LIBSSH2_SFTP *sftp,char *path,uint path_len,long mode)

{
  uint32_t uVar1;
  LIBSSH2_CHANNEL *channel_00;
  int iVar2;
  ssize_t sVar3;
  uchar *puVar4;
  ssize_t nwritten;
  uchar *puStack_a8;
  int rc;
  uchar *data;
  uchar *s;
  uchar *packet;
  ssize_t packet_len;
  size_t sStack_80;
  uint32_t retcode;
  size_t data_len;
  LIBSSH2_SFTP_ATTRIBUTES attrs;
  LIBSSH2_SESSION *session;
  LIBSSH2_CHANNEL *channel;
  long mode_local;
  uint path_len_local;
  char *path_local;
  LIBSSH2_SFTP *sftp_local;
  
  channel_00 = sftp->channel;
  attrs.mtime = (unsigned_long)channel_00->session;
  memset(&data_len,0,0x38);
  sStack_80 = 0;
  puStack_a8 = (uchar *)0x0;
  if (mode != -1) {
    data_len = 4;
    attrs.gid = mode | 0x4000;
  }
  iVar2 = sftp_attrsize(data_len);
  packet = (uchar *)(ulong)(path_len + 0xd + iVar2);
  if (sftp->mkdir_state == libssh2_NB_state_idle) {
    sftp->last_errno = 0;
    data = (uchar *)(**(code **)(attrs.mtime + 8))(packet,attrs.mtime);
    s = data;
    if (data == (uchar *)0x0) {
      iVar2 = _libssh2_error((LIBSSH2_SESSION *)attrs.mtime,-6,
                             "Unable to allocate memory for FXP_MKDIR packet");
      return iVar2;
    }
    _libssh2_store_u32(&data,(int)packet - 4);
    *data = '\x0e';
    uVar1 = sftp->request_id;
    sftp->request_id = uVar1 + 1;
    sftp->mkdir_request_id = uVar1;
    data = data + 1;
    _libssh2_store_u32(&data,sftp->mkdir_request_id);
    _libssh2_store_str(&data,path,(ulong)path_len);
    sVar3 = sftp_attr2bin(data,(LIBSSH2_SFTP_ATTRIBUTES *)&data_len);
    data = data + sVar3;
    sftp->mkdir_state = libssh2_NB_state_created;
  }
  else {
    s = sftp->mkdir_packet;
  }
  if (sftp->mkdir_state == libssh2_NB_state_created) {
    puVar4 = (uchar *)_libssh2_channel_write(channel_00,0,s,(size_t)packet);
    if (puVar4 == (uchar *)0xffffffffffffffdb) {
      sftp->mkdir_packet = s;
      return -0x25;
    }
    if (packet != puVar4) {
      (**(code **)(attrs.mtime + 0x18))(s,attrs.mtime);
      sftp->mkdir_state = libssh2_NB_state_idle;
      iVar2 = _libssh2_error((LIBSSH2_SESSION *)attrs.mtime,-7,"_libssh2_channel_write() failed");
      return iVar2;
    }
    (**(code **)(attrs.mtime + 0x18))(s,attrs.mtime);
    sftp->mkdir_state = libssh2_NB_state_sent;
    sftp->mkdir_packet = (uchar *)0x0;
  }
  iVar2 = sftp_packet_require(sftp,'e',sftp->mkdir_request_id,&stack0xffffffffffffff58,
                              &stack0xffffffffffffff80,9);
  if (iVar2 == -0x25) {
    sftp_local._4_4_ = -0x25;
  }
  else if (iVar2 == -0x26) {
    if (sStack_80 != 0) {
      (**(code **)(attrs.mtime + 0x18))(puStack_a8,attrs.mtime);
    }
    sftp_local._4_4_ =
         _libssh2_error((LIBSSH2_SESSION *)attrs.mtime,-0x1f,"SFTP mkdir packet too short");
  }
  else if (iVar2 == 0) {
    sftp->mkdir_state = libssh2_NB_state_idle;
    packet_len._4_4_ = _libssh2_ntohu32(puStack_a8 + 5);
    (**(code **)(attrs.mtime + 0x18))(puStack_a8,attrs.mtime);
    if (packet_len._4_4_ == 0) {
      sftp_local._4_4_ = 0;
    }
    else {
      sftp->last_errno = packet_len._4_4_;
      sftp_local._4_4_ = _libssh2_error((LIBSSH2_SESSION *)attrs.mtime,-0x1f,"SFTP Protocol Error");
    }
  }
  else {
    sftp->mkdir_state = libssh2_NB_state_idle;
    sftp_local._4_4_ =
         _libssh2_error((LIBSSH2_SESSION *)attrs.mtime,iVar2,"Error waiting for FXP STATUS");
  }
  return sftp_local._4_4_;
}

Assistant:

static int sftp_mkdir(LIBSSH2_SFTP *sftp, const char *path,
                      unsigned int path_len, long mode)
{
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    LIBSSH2_SFTP_ATTRIBUTES attrs = {
        0, 0, 0, 0, 0, 0, 0
    };
    size_t data_len = 0;
    uint32_t retcode;
    ssize_t packet_len;
    unsigned char *packet, *s, *data = NULL;
    int rc;

    if(mode != LIBSSH2_SFTP_DEFAULT_MODE) {
        /* Filetype in SFTP 3 and earlier */
        attrs.flags = LIBSSH2_SFTP_ATTR_PERMISSIONS;
        attrs.permissions = mode | LIBSSH2_SFTP_ATTR_PFILETYPE_DIR;
    }

    /* 13 = packet_len(4) + packet_type(1) + request_id(4) + path_len(4) */
    packet_len = path_len + 13 + sftp_attrsize(attrs.flags);

    if(sftp->mkdir_state == libssh2_NB_state_idle) {
        sftp->last_errno = LIBSSH2_FX_OK;

        _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                       "Creating directory %s with mode 0%lo", path, mode));
        s = packet = LIBSSH2_ALLOC(session, packet_len);
        if(!packet) {
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for FXP_MKDIR "
                                  "packet");
        }

        _libssh2_store_u32(&s, (uint32_t)(packet_len - 4));
        *(s++) = SSH_FXP_MKDIR;
        sftp->mkdir_request_id = sftp->request_id++;
        _libssh2_store_u32(&s, sftp->mkdir_request_id);
        _libssh2_store_str(&s, path, path_len);

        s += sftp_attr2bin(s, &attrs);

        sftp->mkdir_state = libssh2_NB_state_created;
    }
    else {
        packet = sftp->mkdir_packet;
    }

    if(sftp->mkdir_state == libssh2_NB_state_created) {
        ssize_t nwritten;
        nwritten = _libssh2_channel_write(channel, 0, packet, packet_len);
        if(nwritten == LIBSSH2_ERROR_EAGAIN) {
            sftp->mkdir_packet = packet;
            return (int)nwritten;
        }
        if(packet_len != nwritten) {
            LIBSSH2_FREE(session, packet);
            sftp->mkdir_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "_libssh2_channel_write() failed");
        }
        LIBSSH2_FREE(session, packet);
        sftp->mkdir_state = libssh2_NB_state_sent;
        sftp->mkdir_packet = NULL;
    }

    rc = sftp_packet_require(sftp, SSH_FXP_STATUS, sftp->mkdir_request_id,
                             &data, &data_len, 9);
    if(rc == LIBSSH2_ERROR_EAGAIN) {
        return rc;
    }
    else if(rc == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
        if(data_len > 0) {
            LIBSSH2_FREE(session, data);
        }
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "SFTP mkdir packet too short");
    }
    else if(rc) {
        sftp->mkdir_state = libssh2_NB_state_idle;
        return _libssh2_error(session, rc,
                              "Error waiting for FXP STATUS");
    }

    sftp->mkdir_state = libssh2_NB_state_idle;

    retcode = _libssh2_ntohu32(data + 5);
    LIBSSH2_FREE(session, data);

    if(retcode == LIBSSH2_FX_OK) {
        _libssh2_debug((session, LIBSSH2_TRACE_SFTP, "OK"));
        return 0;
    }
    else {
        sftp->last_errno = retcode;
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "SFTP Protocol Error");
    }
}